

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_ranges.c
# Opt level: O3

int read_unaligned_addr_check
              (Dwarf_Debug dbg,Dwarf_Addr *addr_out,Dwarf_Small *rangeptr,uint address_size,
              Dwarf_Error *error,Dwarf_Small *section_end)

{
  Dwarf_Addr _ltmp;
  Dwarf_Addr local_18;
  
  local_18 = 0;
  if (rangeptr + address_size <= section_end) {
    (*dbg->de_copy_word)(&local_18,rangeptr,(ulong)address_size);
    *addr_out = local_18;
  }
  else {
    _dwarf_error_string(dbg,error,0x14b,
                        "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
  }
  return (uint)(rangeptr + address_size > section_end);
}

Assistant:

static int
read_unaligned_addr_check(Dwarf_Debug dbg,
    Dwarf_Addr *addr_out,
    Dwarf_Small *rangeptr,
    unsigned address_size,
    Dwarf_Error *error,
    Dwarf_Small *section_end)
{
    Dwarf_Addr a = 0;

    READ_UNALIGNED_CK(dbg,a,
        Dwarf_Addr, rangeptr,
        address_size,
        error,section_end);
    *addr_out = a;
    return DW_DLV_OK;
}